

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::Join<cfd::core::ByteData160,cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData *this,ByteData160 *top,ByteData256 *args)

{
  undefined1 local_40 [8];
  ByteData result;
  ByteData256 *args_local;
  ByteData160 *top_local;
  ByteData *this_local;
  
  result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)args;
  Join<cfd::core::ByteData160>((ByteData *)local_40,this,top);
  Join<cfd::core::ByteData256>
            (__return_storage_ptr__,(ByteData *)local_40,
             (ByteData256 *)
             result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ~ByteData((ByteData *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData Join(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Join(top);
    return result.Join(args...);
  }